

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

void __thiscall QLayout::addChildWidget(QLayout *this,QWidget *w)

{
  QWidget *this_00;
  bool bVar1;
  QWidget *parent;
  QLayout *pQVar2;
  QWidget *pQVar3;
  
  parent = parentWidget(this);
  this_00 = *(QWidget **)(*(long *)&w->field_0x8 + 0x10);
  if (((this_00 != (QWidget *)0x0) && ((w->data->widget_attributes & 0x80) != 0)) &&
     (pQVar2 = QWidget::layout(this_00), pQVar2 != (QLayout *)0x0)) {
    removeWidgetRecursively(&pQVar2->super_QLayoutItem,&w->super_QObject);
  }
  pQVar3 = (QWidget *)0x0;
  if (this_00 == parent) {
    pQVar3 = this_00;
  }
  if (this_00 == (QWidget *)0x0) {
    pQVar3 = this_00;
  }
  if (parent != (QWidget *)0x0) {
    if ((parent->data->widget_attributes & 0x8000) == 0) {
      bVar1 = false;
    }
    else {
      bVar1 = QWidgetPrivate::isExplicitlyHidden(*(QWidgetPrivate **)&w->field_0x8);
      bVar1 = !bVar1;
    }
    if (pQVar3 == (QWidget *)0x0) {
      QWidget::setParent(w,parent);
    }
    QWidget::setAttribute(w,WA_LaidOut,true);
    if (!bVar1) {
      return;
    }
    QMetaObject::invokeMethod<>(&w->super_QObject,"_q_showIfNotHidden",QueuedConnection);
    return;
  }
  QWidget::setAttribute(w,WA_LaidOut,true);
  return;
}

Assistant:

void QLayout::addChildWidget(QWidget *w)
{
    QWidget *mw = parentWidget();
    QWidget *pw = w->parentWidget();

    //Qt::WA_LaidOut is never reset. It only means that the widget at some point has
    //been in a layout.
    if (pw && w->testAttribute(Qt::WA_LaidOut)) {
        QLayout *l = pw->layout();
        if (l && removeWidgetRecursively(l, w)) {
#ifdef QT_DEBUG
            if (Q_UNLIKELY(layoutDebug()))
                qWarning("QLayout::addChildWidget: %s \"%ls\" is already in a layout; moved to new layout",
                         w->metaObject()->className(), qUtf16Printable(w->objectName()));
#endif
        }
    }
    if (pw && mw && pw != mw) {
#ifdef QT_DEBUG
            if (Q_UNLIKELY(layoutDebug()))
                qWarning("QLayout::addChildWidget: %s \"%ls\" in wrong parent; moved to correct parent",
                         w->metaObject()->className(), qUtf16Printable(w->objectName()));
#endif
        pw = nullptr;
    }
    bool needShow = mw && mw->isVisible() && !QWidgetPrivate::get(w)->isExplicitlyHidden();
    if (!pw && mw)
        w->setParent(mw);
    w->setAttribute(Qt::WA_LaidOut);
    if (needShow)
        QMetaObject::invokeMethod(w, "_q_showIfNotHidden", Qt::QueuedConnection); //show later
}